

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_point.cpp
# Opt level: O0

void __thiscall test_position_scl_div::test_method(test_position_scl_div *this)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  const_reference pdVar5;
  reference pdVar6;
  point<double,_3UL> r;
  double q;
  point<double,_3UL> p;
  size_t i;
  point<double,_3UL> *retval;
  basic_cstring<const_char> *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  array<double,_3UL> *in_stack_fffffffffffffd40;
  double in_stack_fffffffffffffd68;
  basic_cstring<const_char> *this_00;
  double in_stack_fffffffffffffd70;
  undefined1 *puVar7;
  double in_stack_fffffffffffffd78;
  char *s;
  undefined1 local_1f8 [16];
  basic_cstring<const_char> local_1e8;
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [16];
  basic_cstring<const_char> local_1a0;
  undefined1 local_190 [16];
  basic_cstring<const_char> local_180;
  undefined1 local_170 [40];
  undefined1 local_148 [16];
  basic_cstring<const_char> local_138;
  undefined1 local_128 [32];
  basic_cstring<const_char> local_108;
  undefined1 local_f8 [40];
  undefined1 local_d0 [16];
  basic_cstring<const_char> local_c0;
  undefined1 local_b0 [24];
  double local_98;
  undefined1 local_90 [32];
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  ulong local_40;
  double *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  ulong local_20;
  undefined1 *local_18;
  ulong local_10;
  undefined1 *local_8;
  
  make_point<double>(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_98 = 3.0;
  local_28 = local_b0;
  local_38 = &local_98;
  local_30 = local_90;
  perior::point<double,_3UL>::point((point<double,_3UL> *)in_stack_fffffffffffffd30);
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    local_8 = local_30;
    local_10 = local_40;
    pdVar5 = boost::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
    dVar1 = *pdVar5;
    dVar2 = *local_38;
    local_18 = local_b0;
    local_20 = local_40;
    pdVar6 = boost::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
    *pdVar6 = dVar1 / dVar2;
  }
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/test/test_point.cpp"
               ,99);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_c0,0x68,local_d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/test/test_point.cpp"
               ,99);
    local_48 = local_b0;
    local_50 = 0;
    pdVar6 = boost::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
    local_128._8_8_ = 0.3333333333333333;
    local_128._0_8_ = 1e-12;
    in_stack_fffffffffffffd40 = (array<double,_3UL> *)local_128;
    in_stack_fffffffffffffd38 = "1./3.0";
    in_stack_fffffffffffffd30 = (basic_cstring<const_char> *)(local_128 + 8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,double>
              (local_f8,&local_108,0x68,1,9,pdVar6,"r[0]");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10f9db);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/test/test_point.cpp"
               ,99);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,&local_138,0x69,local_148);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/test/test_point.cpp"
               ,99);
    local_58 = local_b0;
    local_60 = 1;
    pdVar6 = boost::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
    local_190._8_8_ = 0.6666666666666666;
    local_190._0_8_ = 1e-12;
    in_stack_fffffffffffffd40 = (array<double,_3UL> *)local_190;
    in_stack_fffffffffffffd38 = "2./3.0";
    in_stack_fffffffffffffd30 = (basic_cstring<const_char> *)(local_190 + 8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,double>
              (local_170,&local_180,0x69,1,9,pdVar6,"r[1]");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10fb62);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  do {
    uVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    s = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/test/test_point.cpp"
    ;
    this_00 = &local_1a0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/test/test_point.cpp"
               ,99);
    puVar7 = local_1b0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar3,this_00,0x6a,puVar7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd38,(char (*) [1])in_stack_fffffffffffffd30);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_1e8,s,99);
    local_68 = local_b0;
    local_70 = 2;
    pdVar6 = boost::array<double,_3UL>::operator[]
                       (in_stack_fffffffffffffd40,(size_type)in_stack_fffffffffffffd38);
    local_1f8._8_8_ = 1.0;
    local_1f8._0_8_ = 1e-12;
    in_stack_fffffffffffffd40 = (array<double,_3UL> *)local_1f8;
    in_stack_fffffffffffffd38 = "3./3.0";
    in_stack_fffffffffffffd30 = (basic_cstring<const_char> *)(local_1f8 + 8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,double>
              (local_1d8,&local_1e8,0x6a,1,9,pdVar6,"r[2]");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10fcdd);
    bVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar4);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_position_scl_div)
{
    perior::point<double, 3> p = make_point(1., 2., 3.);
    double q = 3;
    perior::point<double, 3> r = p / q;
    BOOST_CHECK_CLOSE_FRACTION(r[0], 1./3.0, 1e-12);
    BOOST_CHECK_CLOSE_FRACTION(r[1], 2./3.0, 1e-12);
    BOOST_CHECK_CLOSE_FRACTION(r[2], 3./3.0, 1e-12);
}